

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

int mbedtls_poly1305_finish(mbedtls_poly1305_context *ctx,uchar *mac)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (ctx->queue_len != 0) {
    ctx->queue[ctx->queue_len] = '\x01';
    sVar5 = ctx->queue_len;
    ctx->queue_len = sVar5 + 1;
    memset(ctx->queue + sVar5 + 1,0,0xf - sVar5);
    poly1305_process(ctx,1,ctx->queue,0);
  }
  uVar1 = ctx->acc[2];
  uVar2 = ctx->acc[3];
  uVar14 = (ulong)ctx->acc[0] + 5;
  uVar12 = (uVar14 >> 0x20) + (ulong)ctx->acc[1];
  uVar11 = (uVar12 >> 0x20) + (ulong)uVar1;
  lVar10 = (uVar11 >> 0x20) + (ulong)uVar2;
  uVar13 = (int)((ulong)lVar10 >> 0x20) + ctx->acc[4] >> 2;
  uVar6 = -uVar13;
  uVar13 = uVar13 - 1;
  uVar7 = uVar6 & (uint)uVar14 | uVar13 & ctx->acc[0];
  iVar8 = uVar7 + ctx->s[0];
  uVar3 = ctx->s[2];
  uVar12 = (ulong)ctx->s[1] + (ulong)(uVar6 & (uint)uVar12 | uVar13 & ctx->acc[1]) +
           (ulong)CARRY4(uVar7,ctx->s[0]);
  uVar4 = ctx->s[3];
  *mac = (uchar)iVar8;
  mac[1] = (uchar)((uint)iVar8 >> 8);
  mac[2] = (uchar)((uint)iVar8 >> 0x10);
  mac[3] = (uchar)((uint)iVar8 >> 0x18);
  mac[4] = (uchar)uVar12;
  mac[5] = (uchar)(uVar12 >> 8);
  mac[6] = (uchar)(uVar12 >> 0x10);
  mac[7] = (uchar)(uVar12 >> 0x18);
  lVar9 = (uVar12 >> 0x20) + (ulong)uVar3 + (ulong)(uVar6 & (uint)uVar11 | uVar13 & uVar1);
  mac[8] = (uchar)lVar9;
  mac[9] = (uchar)((ulong)lVar9 >> 8);
  mac[10] = (uchar)((ulong)lVar9 >> 0x10);
  mac[0xb] = (uchar)((ulong)lVar9 >> 0x18);
  iVar8 = (uVar6 & (uint)lVar10 | uVar13 & uVar2) + uVar4 + (int)((ulong)lVar9 >> 0x20);
  mac[0xc] = (uchar)iVar8;
  mac[0xd] = (uchar)((uint)iVar8 >> 8);
  mac[0xe] = (uchar)((uint)iVar8 >> 0x10);
  mac[0xf] = (uchar)((uint)iVar8 >> 0x18);
  return 0;
}

Assistant:

int mbedtls_poly1305_finish( mbedtls_poly1305_context *ctx,
                             unsigned char mac[16] )
{
    POLY1305_VALIDATE_RET( ctx != NULL );
    POLY1305_VALIDATE_RET( mac != NULL );

    /* Process any leftover data */
    if( ctx->queue_len > 0U )
    {
        /* Add padding bit */
        ctx->queue[ctx->queue_len] = 1U;
        ctx->queue_len++;

        /* Pad with zeroes */
        memset( &ctx->queue[ctx->queue_len],
                0,
                POLY1305_BLOCK_SIZE_BYTES - ctx->queue_len );

        poly1305_process( ctx, 1U,          /* Process 1 block */
                          ctx->queue, 0U ); /* Already padded above */
    }

    poly1305_compute_mac( ctx, mac );

    return( 0 );
}